

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O2

void __thiscall
google::protobuf::io::FileOutputStream::CopyingFileOutputStream::~CopyingFileOutputStream
          (CopyingFileOutputStream *this)

{
  bool bVar1;
  LogMessage *this_00;
  LogMessage LStack_28;
  char *local_18;
  
  if (this->close_on_delete_ == true) {
    bVar1 = Close(this);
    if (!bVar1) {
      absl::lts_20250127::log_internal::LogMessage::LogMessage
                (&LStack_28,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl.cc"
                 ,0xac);
      this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<
                          (&LStack_28,(char (*) [17])"close() failed: ");
      local_18 = strerror(this->errno_);
      absl::lts_20250127::log_internal::LogMessage::operator<<<char_*,_0>(this_00,&local_18);
      absl::lts_20250127::log_internal::LogMessage::~LogMessage(&LStack_28);
    }
  }
  return;
}

Assistant:

FileOutputStream::CopyingFileOutputStream::~CopyingFileOutputStream() {
  if (close_on_delete_) {
    if (!Close()) {
      ABSL_LOG(ERROR) << "close() failed: " << strerror(errno_);
    }
  }
}